

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItemWrapper.cpp
# Opt level: O2

void __thiscall ItemWrapper::setItemName(ItemWrapper *this,string item)

{
  string local_30;
  
  Item::getName_abi_cxx11_(&local_30,&this->classItem);
  std::__cxx11::string::operator=((string *)&this->itemName,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void ItemWrapper::setItemName(std::string item) {
    itemName = classItem.getName();
}